

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

string * __thiscall
spvtools::utils::CardinalToOrdinal_abi_cxx11_
          (string *__return_storage_ptr__,utils *this,size_t cardinal)

{
  ulong uVar1;
  string local_68;
  undefined1 local_48 [8];
  string suffix;
  size_t mod100;
  size_t mod10;
  size_t cardinal_local;
  
  uVar1 = (ulong)this % 10;
  suffix.field_2._8_8_ = (ulong)this % 100;
  std::__cxx11::string::string((string *)local_48);
  if ((uVar1 == 1) && (suffix.field_2._8_8_ != 0xb)) {
    std::__cxx11::string::operator=((string *)local_48,"st");
  }
  else if ((uVar1 == 2) && (suffix.field_2._8_8_ != 0xc)) {
    std::__cxx11::string::operator=((string *)local_48,"nd");
  }
  else if ((uVar1 == 3) && (suffix.field_2._8_8_ != 0xd)) {
    std::__cxx11::string::operator=((string *)local_48,"rd");
  }
  else {
    std::__cxx11::string::operator=((string *)local_48,"th");
  }
  ToString<unsigned_long>(&local_68,(unsigned_long)this);
  std::operator+(__return_storage_ptr__,&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string CardinalToOrdinal(size_t cardinal) {
  const size_t mod10 = cardinal % 10;
  const size_t mod100 = cardinal % 100;
  std::string suffix;
  if (mod10 == 1 && mod100 != 11)
    suffix = "st";
  else if (mod10 == 2 && mod100 != 12)
    suffix = "nd";
  else if (mod10 == 3 && mod100 != 13)
    suffix = "rd";
  else
    suffix = "th";

  return ToString(cardinal) + suffix;
}